

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PipelineStateBase.hpp
# Opt level: O2

Uint32 __thiscall
Diligent::PipelineStateBase<Diligent::EngineVkImplTraits>::GetNumBufferSlotsUsed
          (PipelineStateBase<Diligent::EngineVkImplTraits> *this)

{
  char (*in_RCX) [37];
  string msg;
  string local_30;
  
  CheckPipelineReady(this);
  if (((this->
       super_DeviceObjectBase<Diligent::IPipelineStateVk,_Diligent::RenderDeviceVkImpl,_Diligent::PipelineStateDesc>
       ).m_Desc.PipelineType & ~PIPELINE_TYPE_MESH) != PIPELINE_TYPE_GRAPHICS) {
    FormatString<char[26],char[37]>
              (&local_30,(Diligent *)"Debug expression failed:\n",
               (char (*) [26])"this->m_Desc.IsAnyGraphicsPipeline()",in_RCX);
    DebugAssertionFailed
              (local_30._M_dataplus._M_p,"GetNumBufferSlotsUsed",
               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngine/include/PipelineStateBase.hpp"
               ,0x1f9);
    std::__cxx11::string::~string((string *)&local_30);
  }
  return (Uint32)((this->field_6).m_pGraphicsPipelineData)->BufferSlotsUsed;
}

Assistant:

Uint32 GetNumBufferSlotsUsed() const
    {
        CheckPipelineReady();
        VERIFY_EXPR(this->m_Desc.IsAnyGraphicsPipeline());
        return m_pGraphicsPipelineData->BufferSlotsUsed;
    }